

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

UniquePtr<EVP_PKEY> bssl::anon_unknown_0::GetECDSATestKey(void)

{
  __uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true> in_RDI;
  
  KeyFromPEM((anon_unknown_0 *)
             in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,
             "-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
            );
  return (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<EVP_PKEY> GetECDSATestKey() {
  static const char kKeyPEM[] =
      "-----BEGIN PRIVATE KEY-----\n"
      "MIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\n"
      "TYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\n"
      "Rvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n"
      "-----END PRIVATE KEY-----\n";
  return KeyFromPEM(kKeyPEM);
}